

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O2

exr_result_t
extract_chunk_table(_internal_exr_context *ctxt,_internal_exr_part *part,uint64_t **chunktable,
                   uint64_t *chunkminoffset)

{
  _internal_exr_part **pp_Var1;
  _internal_exr_part *part_00;
  exr_result_t eVar2;
  uint64_t *puVar3;
  uint64_t *puVar4;
  ulong uVar5;
  exr_storage_t eVar6;
  uint64_t offset;
  int iVar7;
  ulong uVar8;
  char *pcVar9;
  uint partnum;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  size_t sVar14;
  ulong uVar15;
  bool bVar16;
  uint *in_stack_ffffffffffffff48;
  uint local_ac;
  uint64_t local_a8;
  uint64_t chunkoff;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  int64_t nread;
  uint64_t *curctable;
  uint64_t local_70;
  priv_chunk_leader leader;
  
  chunkoff = part->chunk_table_offset;
  iVar7 = part->chunk_count;
  *chunkminoffset = chunkoff + (long)iVar7 * 8;
  puVar3 = (uint64_t *)part->chunk_table;
  if ((uint64_t *)part->chunk_table != (uint64_t *)0x0) goto LAB_0011bf69;
  nread = 0;
  if (part->chunk_count < 1) {
    pcVar9 = "Invalid file with no chunks";
    eVar2 = 3;
    goto LAB_0011bffa;
  }
  sVar14 = (long)iVar7 * 8;
  if ((0 < ctxt->file_size) && ((ulong)ctxt->file_size < chunkoff + sVar14)) {
    eVar2 = (*ctxt->print_error)(ctxt,3,"chunk table size (%lu) too big for file size (%ld)",sVar14)
    ;
    return eVar2;
  }
  puVar3 = (uint64_t *)(*ctxt->alloc_fn)(sVar14);
  if (puVar3 == (uint64_t *)0x0) {
    eVar2 = (*ctxt->standard_error)(ctxt,1);
    return eVar2;
  }
  eVar2 = (*ctxt->do_read)(ctxt,puVar3,sVar14,&chunkoff,&nread,EXR_MUST_READ_ALL);
  if (eVar2 != 0) {
    (*ctxt->free_fn)(puVar3);
    return eVar2;
  }
  if (ctxt->disable_chunk_reconstruct == '\0') {
    uVar5 = ctxt->file_size;
    if (ctxt->file_size < 1) {
      uVar5 = 0xffffffffffffffff;
    }
    uVar8 = 0;
    uVar15 = (ulong)(uint)part->chunk_count;
    if (part->chunk_count < 1) {
      uVar15 = uVar8;
    }
    uVar10 = 1;
    for (uVar12 = 0; uVar15 != uVar12; uVar12 = uVar12 + 1) {
      if (uVar5 <= puVar3[uVar12]) {
        uVar10 = uVar8;
      }
      if (puVar3[uVar12] < chunkoff) {
        uVar10 = uVar8;
      }
    }
    if ((int)uVar10 == 0) {
      pp_Var1 = ctxt->parts;
      local_a8 = (long)pp_Var1[(long)ctxt->num_parts + -1]->chunk_count * 8 +
                 pp_Var1[(long)ctxt->num_parts + -1]->chunk_table_offset;
      uVar15 = 0xfffffffffffffffe;
      uVar8 = 0xffffffffffffffff;
      do {
        local_90 = uVar8 + 1;
        partnum = (int)uVar15 + 1;
        uVar15 = (ulong)partnum;
        lVar11 = uVar8 + 1;
        uVar8 = local_90;
      } while (pp_Var1[lVar11] != part);
      local_88 = uVar5;
      if (local_90 == 0) {
LAB_0011c15f:
        iVar7 = -1;
        uVar5 = 0;
        while ((long)uVar5 < (long)part->chunk_count) {
          uVar15 = puVar3[uVar5];
          uVar8 = local_a8;
          if (uVar15 < local_88) {
            uVar8 = uVar15;
          }
          if (uVar15 < local_a8) {
            uVar8 = local_a8;
          }
          uVar15 = (ulong)(uint)(part->chunk_count + iVar7);
          if (part->lineorder != EXR_LINEORDER_DECREASING_Y) {
            uVar15 = uVar5 & 0xffffffff;
          }
          local_a8 = uVar8;
          local_98 = uVar5;
          eVar2 = extract_chunk_leader(ctxt,part,(int)local_90,uVar8,&local_a8,&leader);
          if (eVar2 != 0) goto LAB_0011c141;
          eVar6 = part->storage_mode;
          iVar13 = (int)uVar15;
          if ((eVar6 & ~EXR_STORAGE_DEEP_SCANLINE) == EXR_STORAGE_SCANLINE) {
            lVar11 = (long)(part->data_window).min.field_0.field_0.y;
            uVar5 = (leader.field_1.scanline_y - lVar11) / (long)part->lines_per_chunk;
            if ((uVar5 & 0xffffffff80000000) != 0) {
              in_stack_ffffffffffffff48 =
                   (uint *)CONCAT44((int)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                                    (int)part->lines_per_chunk);
              eVar2 = (*ctxt->print_error)
                                (ctxt,0x16,
                                 "Invalid chunk index: %ld reading scanline %d (datawindow min %d) with lines per chunk %d"
                                 ,uVar5,(long)leader.field_1.scanline_y,lVar11,
                                 in_stack_ffffffffffffff48);
              goto LAB_0011c260;
            }
          }
          else {
            local_ac = 0;
            in_stack_ffffffffffffff48 = &local_ac;
            eVar2 = validate_and_compute_tile_chunk_off
                              (ctxt,part,leader.field_1.scanline_y,leader.field_1.field_1.tile_y,
                               leader.field_1.field_1.level_x,leader.field_1.field_1.level_y,
                               (int32_t *)in_stack_ffffffffffffff48);
            uVar15 = (ulong)local_ac;
LAB_0011c260:
            if (eVar2 != 0) goto LAB_0011c141;
            eVar6 = part->storage_mode;
            uVar5 = uVar15;
          }
          if (((eVar6 & ~EXR_STORAGE_DEEP_SCANLINE) == EXR_STORAGE_SCANLINE) &&
             (iVar13 != (int)uVar5)) goto LAB_0011c141;
          puVar3[(int)uVar5] = uVar8;
          iVar7 = iVar7 + -1;
          uVar5 = local_98 + 1;
        }
      }
      else {
        part_00 = pp_Var1[uVar15];
        eVar2 = extract_chunk_table(ctxt,part_00,&curctable,&local_70);
        if (eVar2 == 0) {
          offset = *curctable;
          for (lVar11 = 1; lVar11 < part_00->chunk_count; lVar11 = lVar11 + 1) {
            if (offset < curctable[lVar11]) {
              offset = curctable[lVar11];
            }
          }
          eVar2 = extract_chunk_leader(ctxt,part_00,partnum,offset,&local_a8,&leader);
          if (eVar2 == 0) goto LAB_0011c15f;
        }
LAB_0011c141:
        if (ctxt->strict_header != '\0') {
          (*ctxt->free_fn)(puVar3);
          pcVar9 = "Incomplete / corrupt chunk table, unable to reconstruct";
          eVar2 = 0x16;
LAB_0011bffa:
          eVar2 = (*ctxt->report_error)(ctxt,eVar2,pcVar9);
          return eVar2;
        }
      }
    }
  }
  LOCK();
  puVar4 = (uint64_t *)part->chunk_table;
  bVar16 = puVar4 == (uint64_t *)0x0;
  if (bVar16) {
    part->chunk_table = (atomic_uintptr_t)puVar3;
    puVar4 = (uint64_t *)0x0;
  }
  UNLOCK();
  if (!bVar16) {
    (*ctxt->free_fn)(puVar3);
    puVar3 = puVar4;
  }
LAB_0011bf69:
  *chunktable = puVar3;
  return 0;
}

Assistant:

static exr_result_t
extract_chunk_table (
    const struct _internal_exr_context* ctxt,
    const struct _internal_exr_part*    part,
    uint64_t**                          chunktable,
    uint64_t*                           chunkminoffset)
{
    uint64_t* ctable     = NULL;
    uint64_t  chunkoff   = part->chunk_table_offset;
    uint64_t  chunkbytes = sizeof (uint64_t) * (uint64_t) part->chunk_count;

    *chunkminoffset = chunkoff + chunkbytes;

#if defined(_MSC_VER)
    ctable = (uint64_t*) InterlockedOr64 (
        (int64_t volatile*) &(part->chunk_table), 0);
#else
    ctable = (uint64_t*) atomic_load (
        EXR_CONST_CAST (atomic_uintptr_t*, &(part->chunk_table)));
#endif
    
    if (ctable == NULL)
    {
        int64_t      nread = 0;
        uintptr_t    eptr = 0, nptr = 0;
        int          complete = 1;
        uint64_t     maxoff   = ((uint64_t) -1);
        exr_result_t rv;

        if (part->chunk_count <= 0)
            return ctxt->report_error (
                ctxt, EXR_ERR_INVALID_ARGUMENT, "Invalid file with no chunks");

        if (ctxt->file_size > 0 &&
            chunkbytes + chunkoff > (uint64_t) ctxt->file_size)
            return ctxt->print_error (
                ctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "chunk table size (%" PRIu64 ") too big for file size (%" PRId64
                ")",
                chunkbytes,
                ctxt->file_size);

        ctable = (uint64_t*) ctxt->alloc_fn (chunkbytes);
        if (ctable == NULL)
            return ctxt->standard_error (ctxt, EXR_ERR_OUT_OF_MEMORY);

        rv = ctxt->do_read (
            ctxt, ctable, chunkbytes, &chunkoff, &nread, EXR_MUST_READ_ALL);
        if (rv != EXR_ERR_SUCCESS)
        {
            ctxt->free_fn (ctable);
            return rv;
        }

        if (!ctxt->disable_chunk_reconstruct)
        {
            // could convert table all at once, but need to check if the
            // file is incomplete (i.e. crashed during write and didn't
            // get a complete chunk table), so just do them one at a time
            if (ctxt->file_size > 0) maxoff = (uint64_t) ctxt->file_size;
            for (int ci = 0; ci < part->chunk_count; ++ci)
            {
                uint64_t cchunk = one_to_native64 (ctable[ci]);
                if (cchunk < chunkoff || cchunk >= maxoff) complete = 0;
                ctable[ci] = cchunk;
            }

            if (!complete)
            {
                // The c++ side would basically fail as soon as it
                // failed, but would otherwise swallow all errors, and
                // then just let the reads fail later. We will do
                // something similar, except when in strict mode, we
                // will fail with a corrupt chunk immediately.
                rv = reconstruct_chunk_table (ctxt, part, ctable);
                if (rv != EXR_ERR_SUCCESS && ctxt->strict_header)
                {
                    ctxt->free_fn (ctable);
                    return ctxt->report_error (
                        ctxt,
                        EXR_ERR_BAD_CHUNK_LEADER,
                        "Incomplete / corrupt chunk table, unable to reconstruct");
                }
            }
        }
        else { priv_to_native64 (ctable, part->chunk_count); }

        nptr = (uintptr_t) ctable;
        // see if we win or not
        if (!atomic_compare_exchange_strong (
                EXR_CONST_CAST (atomic_uintptr_t*, &(part->chunk_table)),
                &eptr,
                nptr))
        {
            ctxt->free_fn (ctable);
            ctable = (uint64_t*) eptr;
            if (ctable == NULL)
                return ctxt->standard_error (ctxt, EXR_ERR_OUT_OF_MEMORY);
        }
    }

    *chunktable = ctable;
    return EXR_ERR_SUCCESS;
}